

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pg_functions.cpp
# Opt level: O3

void duckdb_libpgquery::pg_parser_init(void)

{
  long lVar1;
  void *pvVar2;
  undefined8 *puVar3;
  
  lVar1 = __tls_get_addr(&PTR_0248ae98);
  *(undefined4 *)(lVar1 + 0xa58) = 0;
  *(undefined1 *)(lVar1 + 0xa60) = 0;
  *(undefined8 *)(lVar1 + 0x2a78) = 4;
  pvVar2 = calloc(1,0x20);
  if (pvVar2 != (void *)0x0) {
    *(void **)(lVar1 + 0x2a70) = pvVar2;
    *(undefined8 *)(lVar1 + 0x2a68) = 0;
    allocate_new((parser_state *)(lVar1 + 0xa58),1);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = exp2;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void pg_parser_init() {
	pg_parser_state.pg_err_code = PGUNDEFINED;
	pg_parser_state.pg_err_msg[0] = '\0';

	pg_parser_state.malloc_ptr_size = 4;
	auto new_malloc_ptrs = (char **) malloc(sizeof(char *) * pg_parser_state.malloc_ptr_size);
	if (!new_malloc_ptrs) {
		throw std::bad_alloc();
	}
	pg_parser_state.malloc_ptrs = new_malloc_ptrs;
	memset(pg_parser_state.malloc_ptrs, 0, sizeof(char*) * pg_parser_state.malloc_ptr_size);
	pg_parser_state.malloc_ptr_idx = 0;
	allocate_new(&pg_parser_state, 1);
}